

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

vm_obj_id_t CVmObjList::create(int in_root_set,char *lst)

{
  vm_obj_id_t obj_id;
  CVmObjList *this;
  
  obj_id = vm_new_id(in_root_set,1,0);
  this = (CVmObjList *)CVmObject::operator_new(0x10,obj_id);
  CVmObjList(this,lst);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjList::create(VMG_ int in_root_set, const char *lst)
{
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, TRUE, FALSE);
    new (vmg_ id) CVmObjList(vmg_ lst);
    return id;
}